

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<double>::saxpy<double,HighsCDouble>
          (HVectorBase<double> *this,double pivotX,HVectorBase<HighsCDouble> *pivot)

{
  long in_RSI;
  long in_RDI;
  HighsCDouble *this_00;
  double extraout_XMM0_Qa;
  double x1;
  double x0;
  HighsInt iRow;
  HighsInt k;
  HighsCDouble *pivotArray;
  HighsInt *pivotIndex;
  HighsInt pivotCount;
  double *workArray;
  HighsInt *workIndex;
  HighsInt workCount;
  HighsCDouble *in_stack_ffffffffffffff68;
  double a;
  HighsCDouble local_70;
  HighsCDouble *local_60;
  double local_58;
  int local_50;
  int local_4c;
  const_reference local_48;
  const_reference local_40;
  int local_34;
  reference local_30;
  reference local_28;
  int local_1c;
  long local_18;
  
  local_1c = *(int *)(in_RDI + 4);
  local_18 = in_RSI;
  local_28 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),0);
  local_30 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),0);
  local_34 = *(int *)(local_18 + 4);
  local_40 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 8),0);
  local_48 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(local_18 + 0x20),0);
  for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
    local_50 = local_40[local_4c];
    a = local_30[local_50];
    local_58 = a;
    ::operator*(a,in_stack_ffffffffffffff68);
    local_70 = ::operator+(a,in_stack_ffffffffffffff68);
    this_00 = &local_70;
    local_60 = (HighsCDouble *)HighsCDouble::operator_cast_to_double(this_00);
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_28[local_1c] = local_50;
      local_1c = local_1c + 1;
    }
    std::abs((int)this_00);
    in_stack_ffffffffffffff68 = local_60;
    if (extraout_XMM0_Qa < 1e-14) {
      in_stack_ffffffffffffff68 = (HighsCDouble *)0x358dee7a4ad4b81f;
    }
    local_30[local_50] = (value_type)in_stack_ffffffffffffff68;
  }
  *(int *)(in_RDI + 4) = local_1c;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}